

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

void __thiscall iqnet::ssl::Ctx::Ctx(Ctx *this,string *cert_path,string *key_path,bool client)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  Impl *p;
  SSL_METHOD *meth;
  SSL_CTX *pSVar4;
  exception *this_00;
  
  p = (Impl *)operator_new(0x20);
  p->server_verifier = (ConnectionVerifier *)0x0;
  p->client_verifier = (ConnectionVerifier *)0x0;
  p->require_client_cert = false;
  boost::shared_ptr<iqnet::ssl::Ctx::Impl>::shared_ptr<iqnet::ssl::Ctx::Impl>(&this->impl_,p);
  cVar2 = boost::thread_detail::enter_once_region((once_flag *)&ssl_init);
  if (cVar2 != '\0') {
    init_library();
    boost::thread_detail::commit_once_region((once_flag *)&ssl_init);
  }
  if (client) {
    meth = (SSL_METHOD *)TLS_method();
  }
  else {
    meth = (SSL_METHOD *)TLS_server_method();
  }
  pSVar4 = SSL_CTX_new(meth);
  peVar1 = (this->impl_).px;
  if (peVar1 != (element_type *)0x0) {
    peVar1->ctx = (SSL_CTX *)pSVar4;
    SSL_CTX_set_options(pSVar4,0x2000000);
    peVar1 = (this->impl_).px;
    if (peVar1 != (element_type *)0x0) {
      iVar3 = SSL_CTX_use_certificate_file((SSL_CTX *)peVar1->ctx,(cert_path->_M_dataplus)._M_p,1);
      if (iVar3 != 0) {
        peVar1 = (this->impl_).px;
        if (peVar1 == (element_type *)0x0) goto LAB_00168625;
        iVar3 = SSL_CTX_use_PrivateKey_file((SSL_CTX *)peVar1->ctx,(key_path->_M_dataplus)._M_p,1);
        if (iVar3 != 0) {
          peVar1 = (this->impl_).px;
          if (peVar1 == (element_type *)0x0) goto LAB_00168625;
          iVar3 = SSL_CTX_check_private_key((SSL_CTX *)peVar1->ctx);
          if (iVar3 != 0) {
            return;
          }
        }
      }
      this_00 = (exception *)__cxa_allocate_exception(0x30);
      exception::exception(this_00);
      __cxa_throw(this_00,&exception::typeinfo,exception::~exception);
    }
  }
LAB_00168625:
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->() const [T = iqnet::ssl::Ctx::Impl]"
               );
}

Assistant:

Ctx::Ctx( const std::string& cert_path, const std::string& key_path, bool client ):
  impl_(new Impl)
{
  boost::call_once(ssl_init, init_library);
  impl_->ctx = SSL_CTX_new( client ? SSLv23_method() : SSLv23_server_method() );
  set_common_options(impl_->ctx);

  if(
    !SSL_CTX_use_certificate_file( impl_->ctx, cert_path.c_str(), SSL_FILETYPE_PEM ) ||
    !SSL_CTX_use_PrivateKey_file( impl_->ctx, key_path.c_str(), SSL_FILETYPE_PEM ) ||
    !SSL_CTX_check_private_key( impl_->ctx )
  )
    throw exception();
}